

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleMi<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  FastAllocator *this_00;
  ThreadLocal *pTVar10;
  ThreadLocal2 *this_01;
  iterator __position;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  size_t i;
  ulong uVar18;
  uint uVar19;
  size_t sVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  size_t __n;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [16];
  vuint4 v0;
  vuint4 vgeomID;
  vuint4 v1;
  vuint4 v2;
  vuint4 vprimID;
  undefined1 local_c8 [16];
  ulong local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  NodeRecord *local_90;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_78;
  uint local_68 [4];
  char *local_58;
  range<unsigned_int> *local_50;
  undefined1 local_48 [16];
  
  local_78._8_8_ = local_78._0_8_;
  local_78._0_8_ = this;
  uVar5 = current->_begin;
  this_00 = alloc->alloc;
  pTVar10 = alloc->talloc1;
  local_b8 = 0x50;
  this_01 = pTVar10->parent;
  uVar19 = current->_end;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_90 = (NodeRecord *)CONCAT44(local_90._4_4_,current->_end);
    local_a8[8] = 1;
    local_a8._0_8_ = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_88._0_8_ = this_01;
    local_c8[8] = 1;
    local_c8._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)local_88);
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_88._0_8_;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_c8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_c8._0_8_);
    }
    if (local_a8[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_a8._0_8_);
    }
    uVar19 = (uint)local_90;
  }
  uVar18 = (ulong)(uVar19 - uVar5);
  pTVar10->bytesUsed = pTVar10->bytesUsed + local_b8;
  sVar20 = pTVar10->cur;
  uVar17 = (ulong)(-(int)sVar20 & 0xf);
  uVar16 = sVar20 + local_b8 + uVar17;
  pTVar10->cur = uVar16;
  local_90 = __return_storage_ptr__;
  local_50 = current;
  if (pTVar10->end < uVar16) {
    pTVar10->cur = sVar20;
    if (pTVar10->allocBlockSize < local_b8 << 2) {
      local_58 = (char *)FastAllocator::malloc(this_00,(size_t)&local_b8);
    }
    else {
      local_c8._0_8_ = pTVar10->allocBlockSize;
      local_58 = (char *)FastAllocator::malloc(this_00,(size_t)local_c8);
      pTVar10->ptr = local_58;
      sVar20 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
      pTVar10->bytesWasted = sVar20;
      pTVar10->cur = 0;
      pTVar10->end = local_c8._0_8_;
      pTVar10->cur = local_b8;
      if ((ulong)local_c8._0_8_ < local_b8) {
        pTVar10->cur = 0;
        local_c8._0_8_ = pTVar10->allocBlockSize;
        local_58 = (char *)FastAllocator::malloc(this_00,(size_t)local_c8);
        pTVar10->ptr = local_58;
        sVar20 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
        pTVar10->bytesWasted = sVar20;
        pTVar10->cur = 0;
        pTVar10->end = local_c8._0_8_;
        pTVar10->cur = local_b8;
        if ((ulong)local_c8._0_8_ < local_b8) {
          pTVar10->cur = 0;
          local_58 = (char *)0x0;
        }
        else {
          pTVar10->bytesWasted = sVar20;
        }
      }
      else {
        pTVar10->bytesWasted = sVar20;
      }
    }
  }
  else {
    pTVar10->bytesWasted = pTVar10->bytesWasted + uVar17;
    local_58 = pTVar10->ptr + (uVar16 - local_b8);
  }
  local_c8 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_b8 = 0xffffffffffffffff;
  uStack_b0 = 0xffffffff;
  uStack_ac = 0xffffffff;
  local_68[0] = 0xffffffff;
  local_68[1] = 0xffffffff;
  local_68[2] = 0xffffffff;
  local_68[3] = 0xffffffff;
  aVar26 = _DAT_01feba00;
  local_48 = _DAT_01feb9f0;
  if (uVar19 != uVar5) {
    lVar11 = *(long *)local_78._0_8_;
    lVar12 = *(long *)(local_78._0_8_ + 8);
    lVar13 = *(long *)(lVar11 + 0x58);
    lVar14 = *(long *)(lVar11 + 0x68);
    lVar15 = *(long *)(lVar11 + 0x90);
    uVar16 = *(ulong *)(lVar11 + 0xa0);
    lVar11 = *(long *)(local_78._0_8_ + 0x10);
    uVar22 = (uint)(uVar16 >> 2) & 0x3fffffff;
    lVar21 = 0;
    auVar25 = _DAT_01feb9f0;
    do {
      uVar6 = *(uint *)(lVar12 + (ulong)uVar5 * 8 + 4 + lVar21 * 2);
      lVar23 = (ulong)uVar6 * lVar14;
      uVar7 = *(uint *)(lVar13 + lVar23);
      uVar8 = *(uint *)(lVar13 + 4 + lVar23);
      auVar24 = *(undefined1 (*) [16])(lVar15 + uVar7 * uVar16);
      auVar3 = *(undefined1 (*) [16])(lVar15 + uVar8 * uVar16);
      uVar9 = *(uint *)(lVar13 + 8 + lVar23);
      auVar4 = *(undefined1 (*) [16])(lVar15 + uVar9 * uVar16);
      auVar28 = minps(auVar25,auVar24);
      auVar25 = minps(auVar3,auVar4);
      auVar25 = minps(auVar28,auVar25);
      auVar28 = maxps((undefined1  [16])aVar26,auVar24);
      auVar24 = maxps(auVar3,auVar4);
      aVar26 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar28,auVar24);
      *(int *)((long)&local_b8 + lVar21) = (int)lVar11;
      *(uint *)((long)local_68 + lVar21) = uVar6;
      *(uint *)(local_c8 + lVar21) = uVar22 * uVar7;
      *(uint *)(local_a8 + lVar21) = uVar8 * uVar22;
      *(uint *)(local_88 + lVar21) = uVar9 * uVar22;
      lVar21 = lVar21 + 4;
      local_48 = auVar25;
    } while ((uVar18 + (uVar18 == 0)) * 4 != lVar21);
  }
  auVar27 = local_48._0_12_;
  local_78 = aVar26;
  if (uVar19 - uVar5 < 4) {
    __n = uVar18 * -4 + 0x10;
    memset(local_68 + uVar18,0xff,__n);
    memset(local_c8 + uVar18 * 4,0,__n);
    memset(local_a8 + uVar18 * 4,0,__n);
    memset(local_88 + uVar18 * 4,0,__n);
    auVar27 = local_48._0_12_;
    do {
      *(undefined4 *)((long)&local_b8 + uVar18 * 4) = (undefined4)local_b8;
      uVar18 = uVar18 + 1;
    } while (uVar18 != 4);
  }
  *(undefined8 *)local_58 = local_c8._0_8_;
  *(undefined8 *)(local_58 + 8) = local_c8._8_8_;
  *(undefined8 *)(local_58 + 0x10) = local_a8._0_8_;
  *(undefined8 *)(local_58 + 0x18) = local_a8._8_8_;
  *(undefined8 *)(local_58 + 0x20) = local_88._0_8_;
  *(undefined8 *)(local_58 + 0x28) = local_88._8_8_;
  *(ulong *)(local_58 + 0x30) = local_b8;
  *(ulong *)(local_58 + 0x38) = CONCAT44(uStack_ac,uStack_b0);
  *(ulong *)(local_58 + 0x40) = CONCAT44(local_68[1],local_68[0]);
  *(ulong *)(local_58 + 0x48) = CONCAT44(local_68[3],local_68[2]);
  aVar26.m128[3] = (float)(local_50->_end - local_50->_begin);
  aVar26._0_12_ = auVar27;
  (local_90->ref).ptr = (ulong)local_58 | 9;
  (local_90->bounds).lower.field_0 = aVar26;
  (local_90->bounds).upper.field_0 = local_78;
  return local_90;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4i* accel = (Triangle4i*) alloc.malloc1(sizeof(Triangle4i),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 v0 = zero, v1 = zero, v2 = zero;
        vuint4 vgeomID = -1, vprimID = -1;
        const TriangleMesh* __restrict__ const mesh = this->mesh;
        
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID[i] = geomID_;
          vprimID[i] = primID;
          unsigned int int_stride = mesh->vertices0.getStride()/4;
          v0[i] = tri.v[0] * int_stride; 
          v1[i] = tri.v[1] * int_stride;
          v2[i] = tri.v[2] * int_stride;
        }
        
        for (size_t i=items; i<4; i++)
        {
          vgeomID[i] = vgeomID[0];
          vprimID[i] = -1;
          v0[i] = 0;
          v1[i] = 0; 
          v2[i] = 0;
        }
        Triangle4i::store_nt(accel,Triangle4i(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }